

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O2

void cursor_hidden_bitmap(int x,int y)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  DLword *pDVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  uint *puVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  
  uVar2 = displaywidth;
  iVar1 = displaywidth - x;
  if (x + 0x10 <= (int)displaywidth) {
    iVar1 = 0x10;
  }
  iVar17 = displayheight - y;
  if (y + 0x10 <= (int)displayheight) {
    iVar17 = 0x10;
  }
  local_54 = iVar1 - 1U & 0x1f;
  local_60 = -1 << (~(byte)local_54 & 0x1f);
  if (x < 0) {
    uVar15 = -(ulong)(7U - x >> 3);
  }
  else {
    uVar15 = (ulong)((uint)x >> 3);
  }
  uVar15 = (long)DisplayRegion68k + uVar15 + (long)(((int)displaywidth / 0x10) * y) * 2;
  uVar7 = (x & 7U) + ((uint)uVar15 & 3) * 8;
  uVar12 = 0xffffffff;
  uVar9 = 0;
  uVar18 = -(uint)(uVar7 == 0) | ~(-1 << ((byte)uVar7 & 0x1f));
  iVar5 = -uVar7;
  puVar16 = (uint *)(uVar15 & 0xfffffffffffffffc);
  pDVar6 = MonoCursor_savebitmap;
  uVar11 = 0;
  uVar19 = uVar7;
  LastCursorClippingX = iVar1;
  LastCursorClippingY = iVar17;
  local_58 = local_60;
  iVar8 = iVar1;
  uVar14 = uVar7;
  do {
    local_5c = uVar14 + iVar1;
    if (iVar17 < 1) {
      return;
    }
    bVar3 = (byte)iVar5 & 0x1f;
    bVar4 = (byte)uVar19;
    if (uVar9 < uVar7) {
      uVar14 = *puVar16 << (bVar4 & 0x1f);
      if (0x20 < (int)(iVar1 + uVar7)) {
        uVar19 = puVar16[1];
        puVar10 = puVar16 + 2;
        uVar14 = uVar14 | uVar19 >> bVar3 & uVar18;
        goto LAB_0012377e;
      }
      puVar10 = puVar16 + 1;
    }
    else {
      uVar19 = *puVar16;
      puVar10 = puVar16 + 1;
      uVar14 = uVar19 >> bVar3 & uVar18;
LAB_0012377e:
      uVar11 = uVar19 << (bVar4 & 0x1f) & ~uVar18;
    }
    puVar13 = (uint *)pDVar6;
    if ((int)(iVar1 + uVar9) < 0x21) {
LAB_00123842:
      *puVar13 = (uVar14 ^ *puVar13) & local_58 ^ *puVar13;
    }
    else {
      iVar8 = (iVar8 >> 5) + -1;
      *(uint *)pDVar6 = (uVar14 ^ *(uint *)pDVar6) & uVar12 ^ *(uint *)pDVar6;
      puVar13 = (uint *)((long)pDVar6 + 4);
      if (uVar7 == uVar9) {
        for (; 0 < iVar8; iVar8 = iVar8 + -1) {
          uVar19 = *puVar10;
          puVar10 = puVar10 + 1;
          *puVar13 = uVar19;
          puVar13 = puVar13 + 1;
        }
      }
      else {
        for (; 0 < iVar8; iVar8 = iVar8 + -1) {
          uVar19 = *puVar10;
          puVar10 = puVar10 + 1;
          *puVar13 = uVar19 >> bVar3 | uVar11;
          puVar13 = puVar13 + 1;
          uVar11 = uVar19 << (bVar4 & 0x1f);
        }
      }
      if (local_54 != 0x1f) {
        uVar14 = uVar11;
        local_58 = local_60;
        if ((local_5c - 1U & 0x1f) <= local_54) {
          uVar14 = *puVar10 >> bVar3 & uVar18 | uVar11;
        }
        goto LAB_00123842;
      }
    }
    iVar17 = iVar17 + -1;
    uVar19 = uVar9 + 0x10;
    pDVar6 = (DLword *)((long)pDVar6 + (ulong)(uVar19 >> 5) * 4);
    uVar9 = uVar19 & 0x1f;
    local_54 = (iVar1 + uVar9) - 1 & 0x1f;
    uVar12 = -(uint)(uVar9 == 0) | ~(-1 << (-(char)uVar9 & 0x1fU));
    local_60 = -1 << (~(byte)local_54 & 0x1f);
    local_58 = local_60 & uVar12;
    uVar14 = uVar7 + uVar2;
    puVar16 = puVar16 + ((int)uVar14 >> 5);
    uVar7 = uVar14 & 0x1f;
    iVar5 = uVar9 - uVar14;
    uVar19 = uVar14 - uVar19 & 0x1f;
    uVar18 = -(uint)(uVar19 == 0) | ~(-1 << (sbyte)uVar19);
    iVar8 = iVar1 + uVar9;
  } while( true );
}

Assistant:

void cursor_hidden_bitmap(int x, int y)
{
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;
  /* save image */
  srcbase = DisplayRegion68k + (y * DLWORD_PERLINE);
  dstbase = MonoCursor_savebitmap;
  sx = x;
  dx = 0;
  CursorClippingX(x, w); /* w and LastCursorClippingX rest */
  CursorClippingY(y, h); /* h and LastCursorClippingY reset */
  srcbpl = displaywidth;
  dstbpl = HARD_CURSORWIDTH;
  op = 0; /* replace */
  new_bitblt_code;
}